

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error entityValueInitProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Bool XVar1;
  XML_Error XVar2;
  char *pcStack_48;
  XML_Error result;
  char *next;
  char *start;
  char **ppcStack_30;
  int tok;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  parser->m_eventPtr = s;
  next = s;
  ppcStack_30 = nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)parser;
  do {
    pcStack_48 = next;
    start._4_4_ = (*(code *)**(undefined8 **)(s_local + 0x130))
                            (*(undefined8 *)(s_local + 0x130),next,nextPtr_local,
                             &stack0xffffffffffffffb8);
    *(char **)(s_local + 0x238) = pcStack_48;
    if (start._4_4_ < 1) {
      if ((s_local[0x39c] == '\0') && (start._4_4_ != 0)) {
        *ppcStack_30 = end_local;
        parser_local._4_4_ = XML_ERROR_NONE;
      }
      else {
        switch(start._4_4_) {
        case 0:
          parser_local._4_4_ = XML_ERROR_INVALID_TOKEN;
          break;
        case -4:
        default:
          parser_local._4_4_ =
               storeEntityValue((XML_Parser)s_local,*(ENCODING **)(s_local + 0x130),end_local,
                                (char *)nextPtr_local,XML_ACCOUNT_DIRECT);
          break;
        case -2:
          parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
          break;
        case -1:
          parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
        }
      }
      return parser_local._4_4_;
    }
    if (start._4_4_ == 0xc) {
      XVar2 = processXmlDecl((XML_Parser)s_local,0,next,pcStack_48);
      if (XVar2 != XML_ERROR_NONE) {
        return XVar2;
      }
      if (*(int *)(s_local + 0x398) == 2) {
        return XML_ERROR_ABORTED;
      }
      *ppcStack_30 = pcStack_48;
      *(code **)(s_local + 0x220) = entityValueProcessor;
      XVar2 = entityValueProcessor((XML_Parser)s_local,pcStack_48,(char *)nextPtr_local,ppcStack_30)
      ;
      return XVar2;
    }
    if (start._4_4_ == 0xe) {
      XVar1 = accountingDiffTolerated
                        ((XML_Parser)s_local,0xe,end_local,pcStack_48,0x11e2,XML_ACCOUNT_DIRECT);
      if (XVar1 == '\0') {
        accountingOnAbort((XML_Parser)s_local);
        return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      }
      *ppcStack_30 = pcStack_48;
      end_local = pcStack_48;
    }
    else if (start._4_4_ == 0x1d) {
      *ppcStack_30 = pcStack_48;
      return XML_ERROR_SYNTAX;
    }
    next = pcStack_48;
    *(char **)(s_local + 0x230) = pcStack_48;
  } while( true );
}

Assistant:

static enum XML_Error PTRCALL
entityValueInitProcessor(XML_Parser parser, const char *s, const char *end,
                         const char **nextPtr) {
  int tok;
  const char *start = s;
  const char *next = start;
  parser->m_eventPtr = start;

  for (;;) {
    tok = XmlPrologTok(parser->m_encoding, start, end, &next);
    /* Note: Except for XML_TOK_BOM below, these bytes are accounted later in:
             - storeEntityValue
             - processXmlDecl
    */
    parser->m_eventEndPtr = next;
    if (tok <= 0) {
      if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      switch (tok) {
      case XML_TOK_INVALID:
        return XML_ERROR_INVALID_TOKEN;
      case XML_TOK_PARTIAL:
        return XML_ERROR_UNCLOSED_TOKEN;
      case XML_TOK_PARTIAL_CHAR:
        return XML_ERROR_PARTIAL_CHAR;
      case XML_TOK_NONE: /* start == end */
      default:
        break;
      }
      /* found end of entity value - can store it now */
      return storeEntityValue(parser, parser->m_encoding, s, end,
                              XML_ACCOUNT_DIRECT);
    } else if (tok == XML_TOK_XML_DECL) {
      enum XML_Error result;
      result = processXmlDecl(parser, 0, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      /* At this point, m_parsingStatus.parsing cannot be XML_SUSPENDED.  For
       * that to happen, a parameter entity parsing handler must have attempted
       * to suspend the parser, which fails and raises an error.  The parser can
       * be aborted, but can't be suspended.
       */
      if (parser->m_parsingStatus.parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      *nextPtr = next;
      /* stop scanning for text declaration - we found one */
      parser->m_processor = entityValueProcessor;
      return entityValueProcessor(parser, next, end, nextPtr);
    }
    /* XmlPrologTok has now set the encoding based on the BOM it found, and we
       must move s and nextPtr forward to consume the BOM.

       If we didn't, and got XML_TOK_NONE from the next XmlPrologTok call, we
       would leave the BOM in the buffer and return. On the next call to this
       function, our XmlPrologTok call would return XML_TOK_INVALID, since it
       is not valid to have multiple BOMs.
    */
    else if (tok == XML_TOK_BOM) {
#  if XML_GE == 1
      if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                    XML_ACCOUNT_DIRECT)) {
        accountingOnAbort(parser);
        return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      }
#  endif

      *nextPtr = next;
      s = next;
    }
    /* If we get this token, we have the start of what might be a
       normal tag, but not a declaration (i.e. it doesn't begin with
       "<!").  In a DTD context, that isn't legal.
    */
    else if (tok == XML_TOK_INSTANCE_START) {
      *nextPtr = next;
      return XML_ERROR_SYNTAX;
    }
    start = next;
    parser->m_eventPtr = start;
  }
}